

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt5.cpp
# Opt level: O0

bool __thiscall
crnlib::qdxt5::create_selector_clusters
          (qdxt5 *this,uint max_selector_clusters,
          vector<crnlib::vector<unsigned_int>_> *selector_cluster_indices)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  weighted_vec *pwVar5;
  uint64 uVar6;
  vector<unsigned_int> *this_00;
  ulong uVar7;
  uint *puVar8;
  vector<crnlib::vector<unsigned_int>_> *in_RDX;
  uint32 in_ESI;
  qdxt5 *in_RDI;
  uint j;
  vector<unsigned_int> *indices;
  uint i;
  uint first_cluster;
  vector<crnlib::vector<unsigned_int>_> block_type_selector_cluster_indices;
  uint max_clusters;
  uint block_type_1;
  uint weight;
  uint cMaxWeight;
  uint cAlphaDistToWeight;
  int dist;
  int high_alpha;
  int low_alpha;
  float f;
  uint s;
  uint x;
  uint y;
  bool uses_absolute_values;
  float *pDst;
  vec16F sv;
  dxt5_block *dxt5_block;
  uint block_iter;
  uint block_type;
  vector<unsigned_int> selector_vec_remap [2];
  weighted_selector_vec_array selector_vecs [2];
  undefined4 in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd1c;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
  *in_stack_fffffffffffffd20;
  undefined1 in_stack_fffffffffffffd2b;
  uint in_stack_fffffffffffffd2c;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
  *in_stack_fffffffffffffd30;
  undefined1 *local_2a0;
  vector<unsigned_int> *local_288;
  vector<unsigned_int> *local_168;
  vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *local_140;
  uint local_134;
  uint local_124;
  vector<crnlib::vector<unsigned_int>_> local_118;
  uint local_104;
  uint local_100;
  uint local_fc;
  undefined4 local_f8;
  undefined4 local_f4;
  uint local_f0;
  uint local_ec;
  uint local_e8;
  float local_e4;
  uint local_e0;
  uint local_dc;
  uint local_d8;
  byte local_d1;
  float *local_d0;
  vec<16U,_float> local_c8;
  dxt5_block *local_88;
  uint local_80;
  uint local_7c;
  vector<unsigned_int> local_78;
  void *in_stack_ffffffffffffffa0;
  progress_callback_func in_stack_ffffffffffffffa8;
  vector<crnlib::vector<unsigned_int>_> *in_stack_ffffffffffffffb0;
  undefined1 local_48 [4];
  uint in_stack_ffffffffffffffbc;
  weighted_vec_array *in_stack_ffffffffffffffc0;
  threaded_clusterizer<crnlib::vec<16U,_float>_> *in_stack_ffffffffffffffc8;
  undefined1 auStack_28 [20];
  uint32 local_14;
  byte local_1;
  
  local_140 = (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
              local_48;
  auStack_28._8_8_ = in_RDX;
  local_14 = in_ESI;
  do {
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::vector(local_140);
    local_140 = local_140 + 1;
  } while (local_140 !=
           (vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *)
           auStack_28);
  local_168 = &local_78;
  do {
    vector<unsigned_int>::vector(local_168);
    local_168 = local_168 + 1;
  } while (local_168 != (vector<unsigned_int> *)&stack0xffffffffffffffa8);
  for (local_7c = 0; local_7c < 2; local_7c = local_7c + 1) {
    for (local_80 = 0; local_80 < in_RDI->m_num_blocks; local_80 = local_80 + 1) {
      local_88 = get_block(in_RDI,local_80);
      bVar1 = crnlib::dxt5_block::is_alpha6_block((dxt5_block *)in_stack_fffffffffffffd20);
      if (bVar1 == local_7c) {
        vec<16U,_float>::vec(&local_c8);
        local_d0 = vec<16U,_float>::operator[](&local_c8,0);
        local_d1 = 0;
        for (local_d8 = 0; local_d8 < 4; local_d8 = local_d8 + 1) {
          for (local_dc = 0; local_dc < 4; local_dc = local_dc + 1) {
            local_e0 = crnlib::dxt5_block::get_selector(local_88,local_dc,local_d8);
            bVar1 = crnlib::dxt5_block::is_alpha6_block((dxt5_block *)in_stack_fffffffffffffd20);
            if (bVar1) {
              if (local_e0 < 6) {
                local_e4 = (float)*(byte *)((long)&g_dxt5_alpha6_to_linear + (ulong)local_e0);
              }
              else {
                local_d1 = 1;
                local_e4 = 0.0;
              }
            }
            else {
              local_e4 = (float)*(byte *)((long)&g_dxt5_to_linear + (ulong)local_e0);
            }
            *local_d0 = local_e4;
            local_d0 = local_d0 + 1;
          }
        }
        if ((local_d1 & 1) == 0) {
          local_e8 = crnlib::dxt5_block::get_low_alpha(local_88);
          local_ec = crnlib::dxt5_block::get_high_alpha(local_88);
          local_f0 = math::square<int>(local_e8 - local_ec);
          local_f4 = 8;
          local_f8 = 0x800;
          local_fc = math::clamp<unsigned_int>(local_f0 >> 3,1,0x800);
          vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                    ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec> *
                     )(local_48 + (ulong)local_7c * 0x10));
          vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::resize
                    (in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c,
                     (bool)in_stack_fffffffffffffd2b);
          pwVar5 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
                   back((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)(local_48 + (ulong)local_7c * 0x10));
          vec<16U,_float>::operator=(&pwVar5->m_vec,&local_c8);
          uVar3 = local_fc;
          pwVar5 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::
                   back((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                         *)(local_48 + (ulong)local_7c * 0x10));
          pwVar5->m_weight = uVar3;
          vector<unsigned_int>::push_back
                    ((vector<unsigned_int> *)in_stack_fffffffffffffd20,
                     (uint *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
        }
      }
    }
  }
  vector<crnlib::vector<unsigned_int>_>::clear
            ((vector<crnlib::vector<unsigned_int>_> *)in_stack_fffffffffffffd20);
  for (local_100 = 0; local_100 < 2; local_100 = local_100 + 1) {
    bVar1 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::empty
                      ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                        *)(local_48 + (ulong)local_100 * 0x10));
    if ((!bVar1) &&
       (uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                          ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                            *)(local_48 + (ulong)local_100 * 0x10)),
       0.01 <= (float)uVar2 / (float)in_RDI->m_num_blocks)) {
      uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)(local_48 + (ulong)local_100 * 0x10));
      uVar6 = math::emulu(uVar2,local_14);
      local_104 = (uint)((uVar6 + (in_RDI->m_num_blocks - 1)) / (ulong)in_RDI->m_num_blocks);
      uVar3 = math::maximum<unsigned_int>(0x40,local_104);
      uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)(local_48 + (ulong)local_100 * 0x10));
      uVar3 = math::minimum<unsigned_int>(uVar3,uVar2);
      local_104 = uVar3;
      uVar2 = vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::size
                        ((vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>
                          *)(local_48 + (ulong)local_100 * 0x10));
      if (uVar3 < uVar2) {
        vector<crnlib::vector<unsigned_int>_>::vector(&local_118);
        if (local_100 == 0) {
          in_RDI->m_progress_start = in_RDI->m_progress_range;
          in_RDI->m_progress_range = 0x10;
        }
        else {
          in_RDI->m_progress_start = in_RDI->m_progress_range + 0x10;
          in_RDI->m_progress_range = 0x11;
        }
        bVar1 = threaded_clusterizer<crnlib::vec<16U,_float>_>::create_clusters
                          (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                           in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb0,
                           in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        if (bVar1) {
          uVar2 = vector<crnlib::vector<unsigned_int>_>::size
                            ((vector<crnlib::vector<unsigned_int>_> *)auStack_28._8_8_);
          vector<crnlib::vector<unsigned_int>_>::size(&local_118);
          vector<crnlib::vector<unsigned_int>_>::enlarge
                    ((vector<crnlib::vector<unsigned_int>_> *)in_stack_fffffffffffffd20,
                     in_stack_fffffffffffffd1c);
          for (local_124 = 0; uVar4 = vector<crnlib::vector<unsigned_int>_>::size(&local_118),
              local_124 < uVar4; local_124 = local_124 + 1) {
            this_00 = vector<crnlib::vector<unsigned_int>_>::operator[]
                                ((vector<crnlib::vector<unsigned_int>_> *)auStack_28._8_8_,
                                 uVar2 + local_124);
            vector<crnlib::vector<unsigned_int>_>::operator[](&local_118,local_124);
            vector<unsigned_int>::swap
                      ((vector<unsigned_int> *)in_stack_fffffffffffffd20,
                       (vector<unsigned_int> *)
                       CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
            for (local_134 = 0; uVar4 = vector<unsigned_int>::size(this_00), local_134 < uVar4;
                local_134 = local_134 + 1) {
              uVar7 = (ulong)local_100;
              puVar8 = vector<unsigned_int>::at(this_00,local_134);
              puVar8 = vector<unsigned_int>::operator[](&local_78 + uVar7,*puVar8);
              uVar3 = *puVar8;
              puVar8 = vector<unsigned_int>::at(this_00,local_134);
              *puVar8 = uVar3;
            }
          }
          bVar1 = false;
        }
        else {
          local_1 = 0;
          bVar1 = true;
        }
        vector<crnlib::vector<unsigned_int>_>::~vector
                  ((vector<crnlib::vector<unsigned_int>_> *)in_stack_fffffffffffffd20);
        if (bVar1) goto LAB_0018e2d4;
      }
    }
  }
  local_1 = 1;
LAB_0018e2d4:
  local_288 = (vector<unsigned_int> *)&stack0xffffffffffffffa8;
  do {
    local_288 = local_288 + -1;
    vector<unsigned_int>::~vector((vector<unsigned_int> *)in_stack_fffffffffffffd20);
  } while (local_288 != &local_78);
  local_2a0 = auStack_28;
  do {
    local_2a0 = local_2a0 + -0x10;
    vector<crnlib::threaded_clusterizer<crnlib::vec<16U,_float>_>::weighted_vec>::~vector
              (in_stack_fffffffffffffd20);
  } while (local_2a0 != local_48);
  return (bool)(local_1 & 1);
}

Assistant:

bool qdxt5::create_selector_clusters(uint max_selector_clusters, crnlib::vector<crnlib::vector<uint> >& selector_cluster_indices) {
  weighted_selector_vec_array selector_vecs[2];
  crnlib::vector<uint> selector_vec_remap[2];

  for (uint block_type = 0; block_type < 2; block_type++) {
    for (uint block_iter = 0; block_iter < m_num_blocks; block_iter++) {
      dxt5_block& dxt5_block = get_block(block_iter);
      if ((uint)dxt5_block.is_alpha6_block() != block_type)
        continue;

      vec16F sv;
      float* pDst = &sv[0];

      bool uses_absolute_values = false;

      for (uint y = 0; y < 4; y++) {
        for (uint x = 0; x < 4; x++) {
          const uint s = dxt5_block.get_selector(x, y);

          float f;
          if (dxt5_block.is_alpha6_block()) {
            if (s >= 6) {
              uses_absolute_values = true;
              f = 0.0f;
            } else
              f = g_dxt5_alpha6_to_linear[s];
          } else
            f = g_dxt5_to_linear[s];

          *pDst++ = f;
        }
      }

      if (uses_absolute_values)
        continue;

      int low_alpha = dxt5_block.get_low_alpha();
      int high_alpha = dxt5_block.get_high_alpha();
      int dist = math::square(low_alpha - high_alpha);

      const uint cAlphaDistToWeight = 8;
      const uint cMaxWeight = 2048;
      uint weight = math::clamp<uint>(dist / cAlphaDistToWeight, 1, cMaxWeight);

      selector_vecs[block_type].resize(selector_vecs[block_type].size() + 1);
      selector_vecs[block_type].back().m_vec = sv;
      selector_vecs[block_type].back().m_weight = weight;

      selector_vec_remap[block_type].push_back(block_iter);
    }
  }

  selector_cluster_indices.clear();

  for (uint block_type = 0; block_type < 2; block_type++) {
    if (selector_vecs[block_type].empty())
      continue;

    if ((selector_vecs[block_type].size() / (float)m_num_blocks) < .01f)
      continue;
    uint max_clusters = static_cast<uint>((math::emulu(selector_vecs[block_type].size(), max_selector_clusters) + (m_num_blocks - 1)) / m_num_blocks);
    max_clusters = math::minimum(math::maximum(64U, max_clusters), selector_vecs[block_type].size());
    if (max_clusters >= selector_vecs[block_type].size())
      continue;

#if QDXT5_DEBUGGING
    trace("max_clusters (%u): %u\n", block_type, max_clusters);
#endif

    crnlib::vector<crnlib::vector<uint> > block_type_selector_cluster_indices;

    if (!block_type) {
      m_progress_start = m_progress_range;
      m_progress_range = 16;
    } else {
      m_progress_start = m_progress_range + 16;
      m_progress_range = 17;
    }

    if (!m_selector_clusterizer.create_clusters(
            selector_vecs[block_type], max_clusters, block_type_selector_cluster_indices, generate_codebook_progress_callback, this)) {
      return false;
    }

    const uint first_cluster = selector_cluster_indices.size();
    selector_cluster_indices.enlarge(block_type_selector_cluster_indices.size());

    for (uint i = 0; i < block_type_selector_cluster_indices.size(); i++) {
      crnlib::vector<uint>& indices = selector_cluster_indices[first_cluster + i];
      indices.swap(block_type_selector_cluster_indices[i]);

      for (uint j = 0; j < indices.size(); j++)
        indices.at(j) = selector_vec_remap[block_type][indices.at(j)];
    }
  }

  return true;
}